

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::Parser::CheckLibraryName_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  pointer pSVar2;
  element_type *peVar3;
  String *pSVar4;
  reference __rhs;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *importName;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
  *__range4;
  String tokenName;
  Parser *this_local;
  String *libraryName;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (__return_storage_ptr__);
  pSVar2 = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
           ::operator->(&this->m_currentSymbol);
  if (pSVar2->type != NameValue) {
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&this->m_currentSymbol);
    bVar1 = IsKeyword(pSVar2->type);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pSVar2 = __gnu_cxx::
           __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
           ::operator->(&this->m_currentSymbol);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&__range4,
             &pSVar2->text);
  peVar3 = std::__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_library);
  pSVar4 = Library::GetName_abi_cxx11_(peVar3);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                          &__range4,pSVar4);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_library);
    pSVar4 = Library::GetName_abi_cxx11_(peVar3);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (__return_storage_ptr__,pSVar4);
  }
  else {
    __end4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
             ::begin(&this->m_importList);
    importName = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ::end(&this->m_importList);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
                                       *)&importName), bVar1) {
      __rhs = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
              ::operator*(&__end4);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                              &__range4,__rhs);
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
                  (__return_storage_ptr__,__rhs);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>_>
      ::operator++(&__end4);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&__range4);
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::CheckLibraryName() const
	{
		String libraryName;
		if (m_currentSymbol->type == SymbolType::NameValue || IsKeyword(m_currentSymbol->type))
		{
			auto tokenName = m_currentSymbol->text;
			if (tokenName == m_library->GetName())
			{
				libraryName = m_library->GetName();
			}
			else
			{
				for (auto & importName : m_importList)
				{
					if (tokenName == importName)
					{
						libraryName = importName;
						break;
					}
				}
			}
		}
		return libraryName;
	}